

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

DoubleAPFloat * __thiscall
llvm::detail::DoubleAPFloat::operator=(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  APFloat *pAVar1;
  
  if ((this->Semantics == RHS->Semantics) &&
     (pAVar1 = (RHS->Floats)._M_t.
               super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
               super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
               super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl, pAVar1 != (APFloat *)0x0)
     ) {
    APFloat::Storage::operator=
              ((Storage *)
               &(((this->Floats)._M_t.
                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,&pAVar1->U);
    APFloat::Storage::operator=
              ((Storage *)
               &(this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,
               &(RHS->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U);
  }
  else if (this != RHS) {
    pAVar1 = (this->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    if (pAVar1 != (APFloat *)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&this->Floats,pAVar1);
    }
    (this->Floats)._M_t.super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
    _M_t.super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl = (APFloat *)0x0;
    DoubleAPFloat(this,RHS);
  }
  return this;
}

Assistant:

DoubleAPFloat &DoubleAPFloat::operator=(const DoubleAPFloat &RHS) {
  if (Semantics == RHS.Semantics && RHS.Floats) {
    Floats[0] = RHS.Floats[0];
    Floats[1] = RHS.Floats[1];
  } else if (this != &RHS) {
    this->~DoubleAPFloat();
    new (this) DoubleAPFloat(RHS);
  }
  return *this;
}